

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall
irr::video::CNullDriver::runOcclusionQuery(CNullDriver *this,ISceneNode *node,bool visible)

{
  code *pcVar1;
  IMesh *pIVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar6;
  undefined4 extraout_var_01;
  u32 i;
  undefined1 local_e8 [16];
  anon_union_8_2_439e2c06_for_SOccQuery_2 aStack_d8;
  matrix4 *local_d0;
  u8 local_47;
  byte local_46;
  byte local_38;
  
  if (node != (ISceneNode *)0x0) {
    local_e8._8_8_ = (IMesh *)0x0;
    aStack_d8.PID = (void *)0x0;
    local_d0 = (matrix4 *)0xffffffffffffffff;
    pcVar1 = (code *)((long)(node->AbsoluteTransformation).M +
                     (long)(node->_vptr_ISceneNode[-3] + -0x20));
    *(int *)pcVar1 = *(int *)pcVar1 + 1;
    local_e8._0_8_ = node;
    uVar3 = core::array<irr::video::CNullDriver::SOccQuery>::linear_search
                      (&this->OcclusionQueries,(SOccQuery *)local_e8);
    SOccQuery::~SOccQuery((SOccQuery *)local_e8);
    if (uVar3 != 0xffffffff) {
      (this->OcclusionQueries).m_data.
      super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar3].Run = 0;
      if (!visible) {
        SMaterial::SMaterial((SMaterial *)local_e8);
        local_47 = '\0';
        local_46 = local_46 & 0xf0;
        local_38 = local_38 & 0xc3;
        (*(this->super_IVideoDriver)._vptr_IVideoDriver[0xc])(this,local_e8);
        SMaterial::~SMaterial((SMaterial *)local_e8);
      }
      iVar4 = (*node->_vptr_ISceneNode[10])(node);
      (*(this->super_IVideoDriver)._vptr_IVideoDriver[6])(this,1,CONCAT44(extraout_var,iVar4));
      pIVar2 = (this->OcclusionQueries).m_data.
               super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].Mesh;
      for (uVar3 = 0; uVar5 = (**pIVar2->_vptr_IMesh)(pIVar2), uVar3 < uVar5; uVar3 = uVar3 + 1) {
        if (visible) {
          iVar4 = (*pIVar2->_vptr_IMesh[1])(pIVar2,(ulong)uVar3);
          uVar6 = (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar4))
                            ((undefined8 *)CONCAT44(extraout_var_00,iVar4));
          (*(this->super_IVideoDriver)._vptr_IVideoDriver[0xc])(this,uVar6);
        }
        iVar4 = (*pIVar2->_vptr_IMesh[1])(pIVar2,(ulong)uVar3);
        (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x36])(this,CONCAT44(extraout_var_01,iVar4))
        ;
      }
    }
  }
  return;
}

Assistant:

void CNullDriver::runOcclusionQuery(scene::ISceneNode *node, bool visible)
{
	if (!node)
		return;
	s32 index = OcclusionQueries.linear_search(SOccQuery(node));
	if (index == -1)
		return;
	OcclusionQueries[index].Run = 0;
	if (!visible) {
		SMaterial mat;
		mat.Lighting = false;
		mat.AntiAliasing = 0;
		mat.ColorMask = ECP_NONE;
		mat.GouraudShading = false;
		mat.ZWriteEnable = EZW_OFF;
		setMaterial(mat);
	}
	setTransform(video::ETS_WORLD, node->getAbsoluteTransformation());
	const scene::IMesh *mesh = OcclusionQueries[index].Mesh;
	for (u32 i = 0; i < mesh->getMeshBufferCount(); ++i) {
		if (visible)
			setMaterial(mesh->getMeshBuffer(i)->getMaterial());
		drawMeshBuffer(mesh->getMeshBuffer(i));
	}
}